

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

void Abc_NtkDropSatOutputs(Abc_Ntk_t *pNtk,Vec_Ptr_t *vCexes,int fVerbose)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  void *pvVar5;
  Abc_Obj_t *pFaninNew_00;
  Abc_Obj_t *pFaninOld;
  uint local_40;
  int local_3c;
  int Counter;
  int i;
  Abc_Obj_t *pFaninNew;
  Abc_Obj_t *pConst0;
  Abc_Obj_t *pObj;
  int fVerbose_local;
  Vec_Ptr_t *vCexes_local;
  Abc_Ntk_t *pNtk_local;
  
  local_40 = 0;
  iVar1 = Vec_PtrSize(vCexes);
  iVar2 = Abc_NtkPoNum(pNtk);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_PtrSize(vCexes) == Abc_NtkPoNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                  ,0x705,"void Abc_NtkDropSatOutputs(Abc_Ntk_t *, Vec_Ptr_t *, int)");
  }
  pAVar3 = Abc_AigConst1(pNtk);
  pAVar3 = Abc_ObjNot(pAVar3);
  local_3c = 0;
  do {
    iVar1 = Abc_NtkPoNum(pNtk);
    if (iVar1 <= local_3c) {
      if (fVerbose != 0) {
        printf("Logic cones of %d POs have been replaced by constant 0.\n",(ulong)local_40);
      }
      Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
      return;
    }
    pAVar4 = Abc_NtkPo(pNtk,local_3c);
    pvVar5 = Vec_PtrEntry(vCexes,local_3c);
    if (pvVar5 != (void *)0x0) {
      local_40 = local_40 + 1;
      iVar1 = Abc_ObjFaninC0(pAVar4);
      pFaninNew_00 = Abc_ObjNotCond(pAVar3,iVar1);
      pFaninOld = Abc_ObjFanin0(pAVar4);
      Abc_ObjPatchFanin(pAVar4,pFaninOld,pFaninNew_00);
      pAVar4 = Abc_ObjChild0(pAVar4);
      if (pAVar4 != pAVar3) {
        __assert_fail("Abc_ObjChild0(pObj) == pConst0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                      ,0x70e,"void Abc_NtkDropSatOutputs(Abc_Ntk_t *, Vec_Ptr_t *, int)");
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

void Abc_NtkDropSatOutputs( Abc_Ntk_t * pNtk, Vec_Ptr_t * vCexes, int fVerbose )
{
    Abc_Obj_t * pObj, * pConst0, * pFaninNew;
    int i, Counter = 0;
    assert( Vec_PtrSize(vCexes) == Abc_NtkPoNum(pNtk) );
    pConst0 = Abc_ObjNot( Abc_AigConst1(pNtk) );
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if ( Vec_PtrEntry( vCexes, i ) == NULL )
            continue;
        Counter++;
        pFaninNew = Abc_ObjNotCond( pConst0, Abc_ObjFaninC0(pObj) );
        Abc_ObjPatchFanin( pObj, Abc_ObjFanin0(pObj), pFaninNew );
        assert( Abc_ObjChild0(pObj) == pConst0 );
        // if a PO is driven by a latch, they have the same name...
//        if ( Abc_ObjIsBo(pObj) )
//            Nm_ManDeleteIdName( pNtk->pManName, Abc_ObjId(pObj) );
    }
    if ( fVerbose )
        printf( "Logic cones of %d POs have been replaced by constant 0.\n", Counter );
    Counter = Abc_AigCleanup( (Abc_Aig_t *)pNtk->pManFunc );
//    printf( "Cleanup removed %d nodes.\n", Counter );
}